

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::EmbedParameter::EmbedParameter(EmbedParameter *this,EmbedParameter *from)

{
  void *pvVar1;
  uint32 uVar2;
  FillerParameter *pFVar3;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__EmbedParameter_0071d720;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  if (((from->_has_bits_).has_bits_[0] & 1) == 0) {
    pFVar3 = (FillerParameter *)0x0;
  }
  else {
    pFVar3 = (FillerParameter *)operator_new(0x40);
    FillerParameter::FillerParameter(pFVar3,from->weight_filler_);
  }
  this->weight_filler_ = pFVar3;
  if (((from->_has_bits_).has_bits_[0] & 2) == 0) {
    pFVar3 = (FillerParameter *)0x0;
  }
  else {
    pFVar3 = (FillerParameter *)operator_new(0x40);
    FillerParameter::FillerParameter(pFVar3,from->bias_filler_);
  }
  this->bias_filler_ = pFVar3;
  uVar2 = from->input_dim_;
  this->num_output_ = from->num_output_;
  this->input_dim_ = uVar2;
  this->bias_term_ = from->bias_term_;
  return;
}

Assistant:

EmbedParameter::EmbedParameter(const EmbedParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_weight_filler()) {
    weight_filler_ = new ::caffe::FillerParameter(*from.weight_filler_);
  } else {
    weight_filler_ = NULL;
  }
  if (from.has_bias_filler()) {
    bias_filler_ = new ::caffe::FillerParameter(*from.bias_filler_);
  } else {
    bias_filler_ = NULL;
  }
  ::memcpy(&num_output_, &from.num_output_,
    reinterpret_cast<char*>(&bias_term_) -
    reinterpret_cast<char*>(&num_output_) + sizeof(bias_term_));
  // @@protoc_insertion_point(copy_constructor:caffe.EmbedParameter)
}